

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_input.hpp
# Opt level: O1

void __thiscall MemoryInput::MemoryInput(MemoryInput *this,char *filename)

{
  int __fd;
  void *pvVar1;
  stat sb;
  stat sStack_a8;
  
  this->_vptr_MemoryInput = (_func_int **)&PTR__MemoryInput_00106d98;
  __fd = open(filename,0);
  fstat(__fd,&sStack_a8);
  this->_size = sStack_a8.st_size;
  pvVar1 = mmap((void *)0x0,sStack_a8.st_size,1,2,__fd,0);
  this->_buffer = pvVar1;
  close(__fd);
  return;
}

Assistant:

MemoryInput(const char *filename) {
    int fd = open(filename, O_RDONLY);
    struct stat sb;
    fstat(fd, &sb);
    _size = sb.st_size;
    _buffer = mmap(nullptr, _size, PROT_READ, MAP_PRIVATE, fd, 0);
    close(fd);
  }